

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

ModelPtr __thiscall libcellml::Annotator::encapsulation(Annotator *this,string *id)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPtr MVar1;
  Annotator local_20;
  
  item(&local_20,id);
  AnyCellmlElement::model((AnyCellmlElement *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_20.super_Logger.mPimpl);
  MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Annotator::encapsulation(const std::string &id)
{
    return item(id)->model();
}